

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O2

bool FastPForLib::Simple8b<true>::trymefull<4u,15u>(uint32_t *n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 4) break;
    uVar1 = uVar2 + 1;
  } while (n[uVar2] < 0x8000);
  return 3 < uVar2;
}

Assistant:

static bool trymefull(const uint32_t *n) {
    if (log1 >= 32)
      return true;
    for (uint32_t i = 0; i < num1; i++) {
      if (n[i] >= (1U << (log1 % 32)))
        return false;
    }
    return true;
  }